

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O1

ByteCode * __thiscall ag::Generator::Get(ByteCode *__return_storage_ptr__,Generator *this)

{
  pointer *ppuVar1;
  uint16_t uVar2;
  iterator iVar3;
  pointer pbVar4;
  pointer pcVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  pointer puVar8;
  pointer puVar9;
  size_t sVar10;
  size_t sVar11;
  uchar uVar12;
  int iVar13;
  value_type *__val_1;
  ulong uVar14;
  undefined1 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  pointer pbVar18;
  pointer pvVar19;
  pointer pvVar20;
  pointer pFVar21;
  size_t i;
  long lVar22;
  long lVar23;
  short sVar24;
  uint uVar25;
  size_t sVar26;
  void *pvVar27;
  pointer pvVar28;
  size_t sVar29;
  size_t sVar30;
  bool bVar31;
  long lVar32;
  value_type *__val;
  size_t sVar33;
  size_type *psVar34;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> funcs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> methodStartAddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> funcStartAddr;
  vector<ag::FunctionData,_std::allocator<ag::FunctionData>_> local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  allocator_type local_1d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  void *local_1b8;
  long *local_1b0;
  ulong local_1a8;
  long local_1a0 [2];
  long local_190;
  ByteCode local_188;
  ByteCode local_170;
  long *local_158;
  ulong local_150;
  long local_148 [2];
  long *local_138;
  ulong local_130;
  long local_128 [2];
  long *local_118;
  ulong local_110;
  long local_108 [2];
  long *local_f8;
  ulong local_f0;
  long local_e8 [2];
  long *local_d8;
  ulong local_d0;
  long local_c8 [2];
  long *local_b8;
  size_type local_b0;
  long local_a8 [2];
  ulong local_98;
  ulong local_90;
  long local_88;
  agvariant local_80;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bytes).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"BVM","");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_b0,
             (allocator_type *)&local_1d8);
  if (local_b0 != 0) {
    uVar14 = 0;
    do {
      *(undefined1 *)
       (CONCAT71(local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                 (uchar)local_230.
                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                        _M_impl.super__Vector_impl_data._M_start) + uVar14) =
           *(undefined1 *)((long)local_b8 + uVar14);
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_b0);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             CONCAT71(local_230.
                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                      _M_impl.super__Vector_impl_data._M_start._1_7_,
                      (uchar)local_230.
                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                             ._M_impl.super__Vector_impl_data._M_start),
             local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pvVar27 = (void *)CONCAT71(local_230.
                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             (uchar)local_230.
                                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar27 != (void *)0x0) {
    operator_delete(pvVar27,(long)local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar27
                   );
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = this->m_ver_major;
  iVar3._M_current =
       (__return_storage_ptr__->m_bytes).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->m_bytes).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar3,
               (uchar *)&local_230);
  }
  else {
    *iVar3._M_current =
         (uchar)local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                _M_impl.super__Vector_impl_data._M_start;
    ppuVar1 = &(__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  uVar2 = this->m_ver_minor;
  puVar15 = (undefined1 *)operator_new(2);
  *puVar15 = (char)uVar2;
  puVar15[1] = (char)(uVar2 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
  operator_delete(puVar15,2);
  pbVar18 = (this->m_strtbl).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->m_strtbl).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar16 = (undefined4 *)operator_new(4);
  uVar14 = (long)pbVar4 - (long)pbVar18;
  *puVar16 = 0;
  *(char *)puVar16 = (char)(uVar14 >> 5);
  *(char *)((long)puVar16 + 1) = (char)(uVar14 >> 0xd);
  *(char *)((long)puVar16 + 2) = (char)(uVar14 >> 0x15);
  *(char *)((long)puVar16 + 3) = (char)(uVar14 >> 0x1d);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar16,puVar16 + 1);
  operator_delete(puVar16,4);
  pbVar18 = (this->m_strtbl).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_strtbl).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar18) {
    uVar14 = 0;
    do {
      pcVar5 = pbVar18[uVar14]._M_dataplus._M_p;
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar5,pcVar5 + pbVar18[uVar14]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_d0 + 1,
                 (allocator_type *)&local_1d8);
      if (local_d0 != 0) {
        uVar17 = 0;
        do {
          *(undefined1 *)
           (CONCAT71(local_230.
                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl
                     .super__Vector_impl_data._M_start._1_7_,
                     (uchar)local_230.
                            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                            _M_impl.super__Vector_impl_data._M_start) + uVar17) =
               *(undefined1 *)((long)local_d8 + uVar17);
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_d0);
      }
      local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].field_0x47 = 0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 CONCAT71(local_230.
                          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (uchar)local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                 local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pvVar27 = (void *)CONCAT71(local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (uchar)local_230.
                                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar27 != (void *)0x0) {
        operator_delete(pvVar27,(long)local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar27);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      uVar14 = uVar14 + 1;
      pbVar18 = (this->m_strtbl).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->m_strtbl).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5)
            );
  }
  pbVar18 = (this->m_globals).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->m_globals).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (undefined1 *)operator_new(2);
  uVar25 = (int)pbVar4 - (int)pbVar18;
  *puVar15 = (char)(uVar25 >> 5);
  puVar15[1] = (char)(uVar25 >> 0xd);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
  operator_delete(puVar15,2);
  pbVar18 = (this->m_globals).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_globals).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar18) {
    uVar14 = 0;
    do {
      pcVar5 = pbVar18[uVar14]._M_dataplus._M_p;
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar5,pcVar5 + pbVar18[uVar14]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,local_f0 + 1,
                 (allocator_type *)&local_1d8);
      if (local_f0 != 0) {
        uVar17 = 0;
        do {
          *(undefined1 *)
           (CONCAT71(local_230.
                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl
                     .super__Vector_impl_data._M_start._1_7_,
                     (uchar)local_230.
                            super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                            _M_impl.super__Vector_impl_data._M_start) + uVar17) =
               *(undefined1 *)((long)local_f8 + uVar17);
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_f0);
      }
      local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].field_0x47 = 0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 CONCAT71(local_230.
                          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (uchar)local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
                 local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      pvVar27 = (void *)CONCAT71(local_230.
                                 super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (uchar)local_230.
                                        super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar27 != (void *)0x0) {
        operator_delete(pvVar27,(long)local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar27);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      uVar14 = uVar14 + 1;
      pbVar18 = (this->m_globals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->m_globals).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5)
            );
  }
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::vector
            (&local_230,&(this->Function).m_funcs);
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish == pFVar21) {
    sVar24 = 0;
  }
  else {
    lVar32 = 0;
    uVar14 = 0;
    sVar24 = 0;
    do {
      iVar13 = std::__cxx11::string::compare
                         ((char *)((long)&(pFVar21->Object)._M_dataplus._M_p + lVar32));
      sVar24 = sVar24 + (ushort)(iVar13 == 0);
      uVar14 = uVar14 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      lVar32 = lVar32 + 0x48;
    } while (uVar14 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
  }
  puVar15 = (undefined1 *)operator_new(2);
  *puVar15 = (char)sVar24;
  puVar15[1] = (char)((ushort)sVar24 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
  operator_delete(puVar15,2);
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar21) {
    uVar14 = 0;
    do {
      iVar13 = std::__cxx11::string::compare((char *)(pFVar21 + uVar14));
      if (iVar13 == 0) {
        lVar32 = *(long *)(CONCAT71(local_230.
                                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    (uchar)local_230.
                                           super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 0x20 +
                          uVar14 * 0x48);
        local_118 = local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,lVar32,
                   *(long *)(CONCAT71(local_230.
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      (uchar)local_230.
                                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                             ._M_impl.super__Vector_impl_data._M_start) + 0x28 +
                            uVar14 * 0x48) + lVar32);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_218,local_110 + 1,(allocator_type *)&local_1f8);
        if (local_110 != 0) {
          uVar17 = 0;
          do {
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] = *(uchar *)((long)local_118 + uVar17);
            uVar17 = uVar17 + 1;
          } while (uVar17 < local_110);
        }
        local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] = '\0';
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118 != local_108) {
          operator_delete(local_118,local_108[0] + 1);
        }
        local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)(__return_storage_ptr__->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_218);
        }
        else {
          *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        puVar16 = (undefined4 *)operator_new(4);
        *puVar16 = 0;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,puVar16,puVar16 + 1);
        operator_delete(puVar16,4);
      }
      uVar14 = uVar14 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    } while (uVar14 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
  }
  uVar12 = (char)((uint)(*(int *)&(this->m_consts).
                                  super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(this->m_consts).
                                 super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar12);
  iVar3._M_current =
       (__return_storage_ptr__->m_bytes).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->m_bytes).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar3,
               (uchar *)&local_218);
  }
  else {
    *iVar3._M_current = uVar12;
    ppuVar1 = &(__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  uVar14 = 0;
  do {
    pvVar28 = (this->m_consts).
              super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_consts).
        super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar28) {
      lVar32 = 0;
      uVar17 = 0;
      bVar31 = false;
      do {
        if (uVar14 == *(byte *)((long)&(pvVar28->
                                       super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).
                                       super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       ._M_index + lVar32)) {
          if (!bVar31) {
            std::__detail::__variant::
            _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58,
                              (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&(pvVar28->
                                         super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).
                                         super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                         ._M_u + lVar32));
            uVar12 = (uchar)(0x807010403 >>
                            ((byte)(local_58.
                                    super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .
                                    super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    .
                                    super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                    ._32_4_ << 3) & 0x3f));
            if (4 < local_58.
                    super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    .
                    super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                    ._M_index) {
              uVar12 = '\0';
            }
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_218.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar12);
            iVar3._M_current =
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->m_bytes).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         __return_storage_ptr__,iVar3,(uchar *)&local_218);
            }
            else {
              *iVar3._M_current = uVar12;
              ppuVar1 = &(__return_storage_ptr__->m_bytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_58.
               super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_218,&local_58);
            local_58.
            super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            bVar31 = true;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_80,
                            (_Copy_ctor_base<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&(((this->m_consts).
                                         super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).
                                       super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                                       .
                                       super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
                               + lVar32));
          BitConverter::Get(&local_218,&local_80);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_218.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_218.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_218.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr
            [local_80.
             super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             .
             super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
             ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_1f8,&local_80);
          local_80.
          super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
          ._M_index = 0xff;
        }
        uVar17 = uVar17 + 1;
        pvVar28 = (this->m_consts).
                  super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar32 = lVar32 + 0x28;
      } while (uVar17 < (ulong)(((long)(this->m_consts).
                                       super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar28 >>
                                3) * -0x3333333333333333));
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 5);
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar18 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->m_objNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = (undefined1 *)operator_new(2);
  uVar25 = (int)pbVar4 - (int)pbVar18;
  *puVar15 = (char)(uVar25 >> 5);
  puVar15[1] = (char)(uVar25 >> 0xd);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->m_bytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,puVar15);
  operator_delete(puVar15,2);
  pbVar18 = (this->m_objNames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_objNames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar18) {
    pvVar27 = (void *)0x0;
    do {
      pcVar5 = pbVar18[(long)pvVar27]._M_dataplus._M_p;
      local_158 = local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar5,pcVar5 + pbVar18[(long)pvVar27]._M_string_length);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_1f8,local_150 + 1,&local_1d9);
      if (local_150 != 0) {
        uVar14 = 0;
        do {
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] = *(uchar *)((long)local_158 + uVar14);
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_150);
      }
      local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] = '\0';
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_158 != local_148) {
        operator_delete(local_158,local_148[0] + 1);
      }
      pvVar19 = (this->m_objProps).
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = pvVar19[(long)pvVar27].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar18 = *(pointer *)
                 ((long)&pvVar19[(long)pvVar27].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data + 8);
      local_1b8 = pvVar27;
      puVar15 = (undefined1 *)operator_new(2);
      uVar25 = (int)pbVar18 - (int)uVar6;
      *puVar15 = (char)(uVar25 >> 5);
      puVar15[1] = (char)(uVar25 >> 0xd);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
      operator_delete(puVar15,2);
      pvVar19 = (this->m_objProps).
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar19[(long)pvVar27].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          pvVar19[(long)pvVar27].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar19 = pvVar19 + (long)pvVar27;
        uVar14 = 0;
        do {
          lVar32 = *(long *)&(pvVar19->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data;
          lVar22 = *(long *)(lVar32 + uVar14 * 0x20);
          local_138 = local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,lVar22,*(long *)(lVar32 + 8 + uVar14 * 0x20) + lVar22);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_1f8,local_130 + 1,&local_1d9);
          if (local_130 != 0) {
            uVar17 = 0;
            do {
              local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = *(uchar *)((long)local_138 + uVar17);
              uVar17 = uVar17 + 1;
            } while (uVar17 < local_130);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] = '\0';
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_138 != local_128) {
            operator_delete(local_138,local_128[0] + 1);
          }
          uVar14 = uVar14 + 1;
          pvVar19 = (this->m_objProps).
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pvVar27;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&(pvVar19->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&(pvVar19->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data >> 5));
      }
      pvVar20 = (this->m_objMethods).
                super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar32 = *(long *)&pvVar20[(long)pvVar27].
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data;
      pFVar21 = *(pointer *)
                 ((long)&pvVar20[(long)pvVar27].
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data + 8);
      puVar15 = (undefined1 *)operator_new(2);
      lVar32 = ((long)pFVar21 - lVar32 >> 3) * -0x71c71c71c71c71c7;
      *puVar15 = (char)lVar32;
      puVar15[1] = (char)((ulong)lVar32 >> 8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar15,puVar15 + 2);
      operator_delete(puVar15,2);
      pvVar20 = (this->m_objMethods).
                super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar20[(long)pvVar27].
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar20[(long)pvVar27].
          super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pvVar20 = pvVar20 + (long)pvVar27;
        uVar14 = 0;
        do {
          lVar32 = *(long *)&(pvVar20->
                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                             )._M_impl.super__Vector_impl_data;
          local_1b0 = local_1a0;
          lVar22 = *(long *)(lVar32 + 0x20 + uVar14 * 0x48);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,lVar22,*(long *)(lVar32 + 0x28 + uVar14 * 0x48) + lVar22);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_1f8,local_1a8 + 1,&local_1d9);
          if (local_1a8 != 0) {
            uVar17 = 0;
            do {
              local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] = *(uchar *)((long)local_1b0 + uVar17);
              uVar17 = uVar17 + 1;
            } while (uVar17 < local_1a8);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] = '\0';
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1b0 != local_1a0) {
            operator_delete(local_1b0,local_1a0[0] + 1);
          }
          local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (__return_storage_ptr__->m_bytes).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(__return_storage_ptr__->m_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218,
                       (iterator)
                       local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1f8);
          }
          else {
            *(pointer *)
             local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
            local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_218.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 8);
          }
          puVar16 = (undefined4 *)operator_new(4);
          *puVar16 = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,puVar16,puVar16 + 1);
          operator_delete(puVar16,4);
          pvVar20 = (this->m_objMethods).
                    super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pvVar27;
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)(((long)*(pointer *)
                                          ((long)&(pvVar20->
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                   *(long *)&(pvVar20->
                                             super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                             )._M_impl.super__Vector_impl_data >> 3) *
                                 -0x71c71c71c71c71c7));
      }
      pvVar27 = (void *)((long)local_1b8 + 1);
      pbVar18 = (this->m_objNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pvVar27 < (void *)((long)(this->m_objNames).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >>
                               5));
  }
  pFVar21 = (pointer)CONCAT71(local_230.
                              super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (uchar)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
  if (local_230.super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar21) {
    sVar33 = 0;
    lVar32 = 0;
    do {
      iVar13 = std::__cxx11::string::compare((char *)(pFVar21 + sVar33));
      if (iVar13 == 0) {
        uVar7 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar32];
        puVar8 = (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9 = (__return_storage_ptr__->m_bytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar16 = (undefined4 *)operator_new(4);
        lVar22 = (long)puVar9 - (long)puVar8;
        *puVar16 = 0;
        *(char *)puVar16 = (char)lVar22;
        *(char *)((long)puVar16 + 1) = (char)((ulong)lVar22 >> 8);
        *(char *)((long)puVar16 + 2) = (char)((ulong)lVar22 >> 0x10);
        *(char *)((long)puVar16 + 3) = (char)((ulong)lVar22 >> 0x18);
        lVar22 = 0;
        do {
          (__return_storage_ptr__->m_bytes).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22 + uVar7] = *(uchar *)((long)puVar16 + lVar22);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
        operator_delete(puVar16,4);
        FunctionManager::Get(&local_170,&this->Function,sVar33);
        uVar14 = (long)local_170.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_170.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar14 == 0) {
          pvVar27 = (void *)0x0;
        }
        else {
          if ((long)uVar14 < 0) {
            std::__throw_bad_alloc();
          }
          pvVar27 = operator_new(uVar14);
        }
        sVar29 = (long)local_170.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_170.m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (sVar29 != 0) {
          memmove(pvVar27,local_170.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar29);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,pvVar27,sVar29 + (long)pvVar27);
        if (pvVar27 != (void *)0x0) {
          operator_delete(pvVar27,uVar14);
        }
        if (local_170.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.m_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.m_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.m_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar32 = lVar32 + 1;
      }
      sVar33 = sVar33 + 1;
      pFVar21 = (pointer)CONCAT71(local_230.
                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  (uchar)local_230.
                                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    } while (sVar33 < (ulong)(((long)local_230.
                                     super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar21 >> 3
                              ) * -0x71c71c71c71c71c7));
  }
  if ((this->m_objNames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_objNames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    lVar32 = 0;
    do {
      pvVar20 = (this->m_objMethods).
                super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_190 = uVar14 * 3;
      local_98 = uVar14;
      if (*(pointer *)
           ((long)&pvVar20[uVar14].
                   super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar20[uVar14].super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar14 = 0;
        do {
          lVar22 = *(long *)(local_218.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar32 * 8);
          puVar8 = (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar9 = (__return_storage_ptr__->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar16 = (undefined4 *)operator_new(4);
          lVar23 = (long)puVar9 - (long)puVar8;
          *puVar16 = 0;
          *(char *)puVar16 = (char)lVar23;
          *(char *)((long)puVar16 + 1) = (char)((ulong)lVar23 >> 8);
          *(char *)((long)puVar16 + 2) = (char)((ulong)lVar23 >> 0x10);
          *(char *)((long)puVar16 + 3) = (char)((ulong)lVar23 >> 0x18);
          lVar23 = 0;
          do {
            (__return_storage_ptr__->m_bytes).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23 + lVar22] = *(uchar *)((long)puVar16 + lVar23);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 4);
          local_88 = lVar32;
          operator_delete(puVar16,4);
          pFVar21 = (this->Function).m_funcs.
                    super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar32 = (long)(this->Function).m_funcs.
                         super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pFVar21;
          local_90 = uVar14;
          if (lVar32 == 0) {
            sVar33 = 0;
          }
          else {
            lVar22 = *(long *)((long)&(((this->m_objMethods).
                                        super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                      )._M_impl.super__Vector_impl_data + local_190 * 8);
            lVar32 = (lVar32 >> 3) * -0x71c71c71c71c71c7;
            sVar29 = *(size_t *)(lVar22 + 0x28 + uVar14 * 0x48);
            pvVar27 = *(void **)(lVar22 + 0x20 + uVar14 * 0x48);
            local_1b8 = *(void **)(lVar22 + uVar14 * 0x48);
            sVar10 = *(size_t *)(lVar22 + 8 + uVar14 * 0x48);
            sVar26 = lVar32 + (ulong)(lVar32 == 0);
            psVar34 = &(pFVar21->Name)._M_string_length;
            sVar30 = 0;
            do {
              sVar11 = *psVar34;
              if (((sVar11 == sVar29) &&
                  (((sVar11 == 0 ||
                    (iVar13 = bcmp((((string *)(psVar34 + -1))->_M_dataplus)._M_p,pvVar27,sVar11),
                    iVar13 == 0)) && (sVar11 = psVar34[-4], sVar11 == sVar10)))) &&
                 ((sVar33 = sVar30, sVar11 == 0 ||
                  (iVar13 = bcmp((void *)psVar34[-5],local_1b8,sVar11), iVar13 == 0)))) break;
              sVar30 = sVar30 + 1;
              psVar34 = psVar34 + 9;
              sVar33 = sVar26;
            } while (sVar26 != sVar30);
          }
          FunctionManager::Get(&local_188,&this->Function,sVar33);
          uVar14 = (long)local_188.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_188.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar14 == 0) {
            pvVar27 = (void *)0x0;
          }
          else {
            if ((long)uVar14 < 0) {
              std::__throw_bad_alloc();
            }
            pvVar27 = operator_new(uVar14);
          }
          sVar29 = (long)local_188.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_188.m_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (sVar29 != 0) {
            memmove(pvVar27,local_188.m_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar29);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->m_bytes).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,pvVar27,sVar29 + (long)pvVar27);
          if (pvVar27 != (void *)0x0) {
            operator_delete(pvVar27,uVar14);
          }
          if (local_188.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.m_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.m_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.m_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar32 = local_88 + 1;
          pvVar20 = (this->m_objMethods).
                    super__Vector_base<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>,_std::allocator<std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = local_90 + 1;
        } while (uVar14 < (ulong)((*(long *)((long)&(pvVar20->
                                                                                                        
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  )._M_impl.super__Vector_impl_data +
                                            local_190 * 8 + 8) -
                                   *(long *)((long)&(pvVar20->
                                                                                                        
                                                  super__Vector_base<ag::FunctionData,_std::allocator<ag::FunctionData>_>
                                                  )._M_impl.super__Vector_impl_data + local_190 * 8)
                                  >> 3) * -0x71c71c71c71c71c7));
      }
      uVar14 = local_98 + 1;
    } while (uVar14 < (ulong)((long)(this->m_objNames).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_objNames).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<ag::FunctionData,_std::allocator<ag::FunctionData>_>::~vector(&local_230);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get()
		{
			ByteCode bret;


			// header
			bret.Add(BitConverter::GetString(std::string("BVM"), false));


			// version
			bret.Add(m_ver_major);
			bret.Add(BitConverter::GetUInt16(m_ver_minor));


			// string table
			bret.Add(BitConverter::GetUInt32(m_strtbl.size()));
			for (size_t i = 0; i < m_strtbl.size(); i++)
				bret.Add(BitConverter::GetString(m_strtbl[i]));

			// globals
			bret.Add(BitConverter::GetUInt16(m_globals.size()));
			for (size_t i = 0; i < m_globals.size(); i++)
				bret.Add(BitConverter::GetString(m_globals[i]));	// name


															// function names
			std::vector<FunctionData> funcs = Function.GetData();
			std::vector<size_t> funcStartAddr;

			uint16_t funcCount = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;
				funcCount++;
			}
			bret.Add(BitConverter::GetUInt16(funcCount));

			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Add(BitConverter::GetString(funcs[i].Name));
				funcStartAddr.push_back(bret.Count());
				bret.Add(BitConverter::GetUInt32(0u));
			}


			// constants
			bret.Add(m_consts.size());
			for (size_t t = 0; t < variant_type_count; t++) {
				bool written = false;
				for (size_t i = 0; i < m_consts.size(); i++) {
					if (m_consts[i].index() == t) {
						if (!written) {
							bret.Add((uint8_t)VariantToType(m_consts[i]));
							written = true;
						}
						bret.Add(BitConverter::Get(m_consts[i]));
					}
				}
			}


			// objects
			std::vector<size_t> methodStartAddr;
			bret.Add(BitConverter::GetUInt16(m_objNames.size()));
			for (size_t i = 0; i < m_objNames.size(); i++) {
				bret.Add(BitConverter::GetString(m_objNames[i]));

				bret.Add(BitConverter::GetUInt16(m_objProps[i].size()));
				for (size_t j = 0; j < m_objProps[i].size(); j++)
					bret.Add(BitConverter::GetString(m_objProps[i][j]));

				bret.Add(BitConverter::GetUInt16(m_objMethods[i].size()));
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Add(BitConverter::GetString(m_objMethods[i][j].Name));
					methodStartAddr.push_back(bret.Count());
					bret.Add(BitConverter::GetUInt32(0u));
				}
			}


			// function code
			size_t curFunc = 0;
			for (size_t i = 0; i < funcs.size(); i++) {
				if (funcs[i].Object != "")
					continue;

				bret.Write(funcStartAddr[curFunc], BitConverter::GetUInt32(bret.Count()));
				bret.Add(Function.Get(i));
				curFunc++;
			}

			// method code
			size_t curMethod = 0;
			for (size_t i = 0; i < m_objNames.size(); i++) {
				for (size_t j = 0; j < m_objMethods[i].size(); j++) {
					bret.Write(methodStartAddr[curMethod], BitConverter::GetUInt32(bret.Count()));
					bret.Add(Function.Get(m_objMethods[i][j].Name, m_objMethods[i][j].Object));
					// TODO: method overloading
					curMethod++;
				}
			}

			return bret;
		}